

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::Concatenate::dim_forward
          (Dim *__return_storage_ptr__,Concatenate *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  invalid_argument *this_00;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  char *__assertion;
  uint uVar12;
  pointer pDVar13;
  Dim c;
  ostringstream s;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  uint local_1e8;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_1d8;
  pointer local_1d0;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  pDVar13 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = *(undefined8 *)(pDVar13->d + 2);
  uVar5 = *(undefined8 *)(pDVar13->d + 4);
  uVar6 = *(undefined8 *)(pDVar13->d + 6);
  *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar13->d;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar4;
  *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar5;
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar6;
  __return_storage_ptr__->bd = pDVar13->bd;
  uVar8 = (ulong)__return_storage_ptr__->nd;
  if (1 < uVar8) {
    if (__return_storage_ptr__->d[1] != 1) goto LAB_002213a5;
    uVar9 = 1;
    do {
      if ((2 - uVar8) + uVar9 == 1) goto LAB_00221369;
      uVar1 = uVar9 + 1;
      lVar2 = uVar9 + 1;
      uVar9 = uVar1;
    } while (__return_storage_ptr__->d[lVar2] == 1);
    if (uVar1 < uVar8) goto LAB_002213a5;
  }
LAB_00221369:
  __return_storage_ptr__->nd = 1;
LAB_002213a5:
  local_1d0 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (pDVar13 == local_1d0) {
    uVar11 = 0;
  }
  else {
    local_1d8 = xs;
    uVar3 = __return_storage_ptr__->nd;
    uVar12 = __return_storage_ptr__->bd;
    uVar11 = 0;
    do {
      uVar4 = *(undefined8 *)pDVar13->d;
      uStack_1f0 = *(ulong *)(pDVar13->d + 6);
      uStack_200 = *(undefined8 *)(pDVar13->d + 2);
      uStack_1f8 = *(undefined8 *)(pDVar13->d + 4);
      local_1e8 = pDVar13->bd;
      uVar8 = uStack_1f0 >> 0x20;
      if (uVar8 < 2) {
LAB_002213e3:
        uStack_1f0 = CONCAT44(1,(undefined4)uStack_1f0);
      }
      else {
        local_208._4_4_ = (int)((ulong)uVar4 >> 0x20);
        if (local_208._4_4_ == 1) {
          uVar9 = 1;
          do {
            if ((2 - uVar8) + uVar9 == 1) goto LAB_002213e3;
            uVar1 = uVar9 + 1;
            lVar2 = uVar9 * 4;
            uVar9 = uVar1;
          } while (*(int *)((long)&local_208 + lVar2 + 4) == 1);
          if (uVar8 <= uVar1) goto LAB_002213e3;
        }
      }
      uVar10 = 1;
      if (uStack_1f0._4_4_ != 0) {
        local_208._0_4_ = (uint)uVar4;
        uVar10 = (uint)local_208;
      }
      local_208 = uVar4;
      if ((ulong)uVar3 == 0) goto LAB_0022152c;
      if (uVar10 == 0) goto LAB_00221535;
      __return_storage_ptr__->d[0] = uVar10;
      if (((uVar3 != uStack_1f0._4_4_) || (uVar12 != local_1e8)) ||
         (iVar7 = bcmp(__return_storage_ptr__,&local_208,(ulong)uVar3), iVar7 != 0)) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Bad input dimensions in Concatenate: ",0x25);
        operator<<((ostream *)local_1a8,local_1d8);
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(this_00,local_1c8);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      uVar11 = uVar11 + uVar10;
      if (uVar12 <= local_1e8) {
        uVar12 = local_1e8;
      }
      __return_storage_ptr__->bd = uVar12;
      pDVar13 = pDVar13 + 1;
    } while (pDVar13 != local_1d0);
  }
  if (__return_storage_ptr__->nd == 0) {
LAB_0022152c:
    __assertion = "i < nd";
  }
  else {
    if (uVar11 != 0) {
      __return_storage_ptr__->d[0] = uVar11;
      return __return_storage_ptr__;
    }
LAB_00221535:
    __assertion = "s > 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/dim.h"
                ,0x44,"void cnn::Dim::set(unsigned int, unsigned int)");
}

Assistant:

Dim Concatenate::dim_forward(const vector<Dim>& xs) const {
  unsigned new_rows = 0;
  Dim dr = xs[0];
  if (LooksLikeVector(dr)) dr.resize(1);
  for (auto c : xs) {
    if (LooksLikeVector(c)) c.resize(1);
    new_rows += c[0];
    dr.set(0, c[0]);
    if (dr != c) {
      ostringstream s; s << "Bad input dimensions in Concatenate: " << xs;
      throw std::invalid_argument(s.str());
    }
    dr.bd = max(dr.bd, c.bd);
  }
  dr.set(0, new_rows);
  return dr;
}